

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ConditionalPatternSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ConditionalPatternSyntax,slang::syntax::ConditionalPatternSyntax_const&>
          (BumpAllocator *this,ConditionalPatternSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  ExpressionSyntax *pEVar3;
  undefined4 uVar4;
  ConditionalPatternSyntax *pCVar5;
  
  pCVar5 = (ConditionalPatternSyntax *)allocate(this,0x28,8);
  uVar4 = *(undefined4 *)&(args->super_SyntaxNode).field_0x4;
  pSVar1 = (args->super_SyntaxNode).parent;
  pSVar2 = (args->super_SyntaxNode).previewNode;
  pEVar3 = (args->expr).ptr;
  (pCVar5->super_SyntaxNode).kind = (args->super_SyntaxNode).kind;
  *(undefined4 *)&(pCVar5->super_SyntaxNode).field_0x4 = uVar4;
  (pCVar5->super_SyntaxNode).parent = pSVar1;
  (pCVar5->super_SyntaxNode).previewNode = pSVar2;
  (pCVar5->expr).ptr = pEVar3;
  pCVar5->matchesClause = args->matchesClause;
  return pCVar5;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }